

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  unixShmNode *pShmNode_00;
  int iVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  undefined8 uVar5;
  void *local_118;
  void *pMem;
  int i;
  int nMap;
  char *zFile;
  int x;
  int iPg;
  stat sStat;
  int nByte;
  char **apNew;
  int nReqRegion;
  int nShmPerMap;
  int rc;
  unixShmNode *pShmNode;
  unixShm *p;
  unixFile *pDbFd;
  void **pp_local;
  int bExtend_local;
  int szRegion_local;
  int iRegion_local;
  sqlite3_file *fd_local;
  
  nReqRegion = 0;
  iVar1 = unixShmRegionPerMap();
  if ((fd[8].pMethods == (sqlite3_io_methods *)0x0) &&
     (nReqRegion = unixOpenSharedMemory((unixFile *)fd), nReqRegion != 0)) {
    return nReqRegion;
  }
  pShmNode_00 = *(unixShmNode **)fd[8].pMethods;
  sqlite3_mutex_enter(pShmNode_00->pShmMutex);
  if (pShmNode_00->isUnlocked != '\0') {
    nReqRegion = unixLockSharedMemory((unixFile *)fd,pShmNode_00);
    if (nReqRegion != 0) goto LAB_0015a5e8;
    pShmNode_00->isUnlocked = '\0';
  }
  iVar2 = ((iRegion + iVar1) / iVar1) * iVar1;
  if ((int)(uint)pShmNode_00->nRegion < iVar2) {
    sStat.__glibc_reserved[2]._4_4_ = iVar2 * szRegion;
    pShmNode_00->szRegion = szRegion;
    if (-1 < pShmNode_00->hShm) {
      iVar3 = (*aSyscall[5].pCurrent)
                        ((ulong)(uint)pShmNode_00->hShm,&x,
                         (long)(iRegion + iVar1) % (long)iVar1 & 0xffffffff);
      if (iVar3 != 0) {
        nReqRegion = 0x130a;
        goto LAB_0015a5e8;
      }
      if ((long)sStat.st_rdev < (long)sStat.__glibc_reserved[2]._4_4_) {
        if (bExtend == 0) goto LAB_0015a5e8;
        for (zFile._4_4_ = (int)((long)sStat.st_rdev / 0x1000);
            zFile._4_4_ < sStat.__glibc_reserved[2]._4_4_ / 0x1000; zFile._4_4_ = zFile._4_4_ + 1) {
          zFile._0_4_ = 0;
          iVar3 = seekAndWriteFd(pShmNode_00->hShm,(long)(zFile._4_4_ * 0x1000 + 0xfff),"",1,
                                 (int *)&zFile);
          if (iVar3 != 1) {
            nReqRegion = unixLogErrorAtLine(0x130a,"write",pShmNode_00->zFilename,0x9165);
            goto LAB_0015a5e8;
          }
        }
      }
    }
    ppcVar4 = (char **)sqlite3_realloc(pShmNode_00->apRegion,iVar2 * 8);
    if (ppcVar4 == (char **)0x0) {
      nReqRegion = 0xc0a;
    }
    else {
      pShmNode_00->apRegion = ppcVar4;
      while ((int)(uint)pShmNode_00->nRegion < iVar2) {
        iVar3 = szRegion * iVar1;
        if (pShmNode_00->hShm < 0) {
          local_118 = sqlite3_malloc64((long)iVar3);
          if (local_118 == (void *)0x0) {
            nReqRegion = 7;
            break;
          }
          memset(local_118,0,(long)iVar3);
        }
        else {
          uVar5 = 3;
          if (pShmNode_00->isReadonly != '\0') {
            uVar5 = 1;
          }
          local_118 = (void *)(*aSyscall[0x16].pCurrent)
                                        (0,(long)iVar3,uVar5,1,(ulong)(uint)pShmNode_00->hShm,
                                         (long)szRegion * (ulong)pShmNode_00->nRegion);
          if (local_118 == (void *)0xffffffffffffffff) {
            nReqRegion = unixLogErrorAtLine(0x150a,"mmap",pShmNode_00->zFilename,0x9180);
            break;
          }
        }
        for (pMem._0_4_ = 0; (int)pMem < iVar1; pMem._0_4_ = (int)pMem + 1) {
          pShmNode_00->apRegion[(int)((uint)pShmNode_00->nRegion + (int)pMem)] =
               (char *)((long)local_118 + (long)(szRegion * (int)pMem));
        }
        pShmNode_00->nRegion = pShmNode_00->nRegion + (short)iVar1;
      }
    }
  }
LAB_0015a5e8:
  if (iRegion < (int)(uint)pShmNode_00->nRegion) {
    *pp = pShmNode_00->apRegion[iRegion];
  }
  else {
    *pp = (void *)0x0;
  }
  if ((pShmNode_00->isReadonly != '\0') && (nReqRegion == 0)) {
    nReqRegion = 8;
  }
  sqlite3_mutex_leave(pShmNode_00->pShmMutex);
  return nReqRegion;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( pShmNode->isUnlocked ){
    rc = unixLockSharedMemory(pDbFd, pShmNode);
    if( rc!=SQLITE_OK ) goto shmpage_out;
    pShmNode->isUnlocked = 0;
  }
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->hShm>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->hShm, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->hShm, iPg*pgsz + pgsz-1,"",1,&x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->hShm>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->hShm, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(nMap);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, nMap);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  return rc;
}